

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDisplayNode.cpp
# Opt level: O0

void __thiscall MinVR::VRDisplayNode::~VRDisplayNode(VRDisplayNode *this)

{
  undefined8 *in_RDI;
  vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_> *unaff_retaddr;
  bool in_stack_0000000f;
  
  *in_RDI = &PTR__VRDisplayNode_001bd528;
  clearChildren(this,in_stack_0000000f);
  std::__cxx11::
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~list((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
           *)0x16d2bb);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x16d2c9);
  std::__cxx11::string::~string((string *)(in_RDI + 4));
  std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>::~vector
            (unaff_retaddr);
  return;
}

Assistant:

VRDisplayNode::~VRDisplayNode() {
	clearChildren(true);
}